

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined4 uVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong unaff_R13;
  size_t mask;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [64];
  uint uVar67;
  uint uVar69;
  uint uVar70;
  undefined1 auVar68 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2860;
  undefined8 uStack_2858;
  long local_2848;
  ulong local_2840;
  ulong local_2838;
  undefined1 (*local_2830) [16];
  Scene *local_2828;
  undefined8 *local_2820;
  ulong local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  RTCHitN local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined4 local_2750;
  undefined4 uStack_274c;
  undefined4 uStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2830 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar85 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = fVar2;
  local_2400._0_4_ = fVar2;
  local_2400._8_4_ = fVar2;
  local_2400._12_4_ = fVar2;
  local_2400._16_4_ = fVar2;
  local_2400._20_4_ = fVar2;
  local_2400._24_4_ = fVar2;
  local_2400._28_4_ = fVar2;
  auVar56 = ZEXT3264(local_2400);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = fVar60;
  local_2420._0_4_ = fVar60;
  local_2420._8_4_ = fVar60;
  local_2420._12_4_ = fVar60;
  local_2420._16_4_ = fVar60;
  local_2420._20_4_ = fVar60;
  local_2420._24_4_ = fVar60;
  local_2420._28_4_ = fVar60;
  auVar59 = ZEXT3264(local_2420);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2838 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2840 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = local_2838 ^ 0x20;
  iVar26 = (tray->tfar).field_0.i[k];
  auVar42 = ZEXT3264(CONCAT428(iVar26,CONCAT424(iVar26,CONCAT420(iVar26,CONCAT416(iVar26,CONCAT412(
                                                  iVar26,CONCAT48(iVar26,CONCAT44(iVar26,iVar26)))))
                                               )));
  local_23e0._8_4_ = 0x80000000;
  local_23e0._0_8_ = 0x8000000080000000;
  local_23e0._12_4_ = 0x80000000;
  local_23e0._16_4_ = 0x80000000;
  local_23e0._20_4_ = 0x80000000;
  local_23e0._24_4_ = 0x80000000;
  local_23e0._28_4_ = 0x80000000;
  local_2818 = local_2840 ^ 0x20;
  local_2440._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar1;
  local_2440._12_4_ = -fVar1;
  local_2440._16_4_ = -fVar1;
  local_2440._20_4_ = -fVar1;
  local_2440._24_4_ = -fVar1;
  local_2440._28_4_ = -fVar1;
  auVar63 = ZEXT3264(local_2440);
  local_2460._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar2;
  local_2460._12_4_ = -fVar2;
  local_2460._16_4_ = -fVar2;
  local_2460._20_4_ = -fVar2;
  local_2460._24_4_ = -fVar2;
  local_2460._28_4_ = -fVar2;
  auVar68 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar60;
  local_2480._12_4_ = -fVar60;
  local_2480._16_4_ = -fVar60;
  local_2480._20_4_ = -fVar60;
  local_2480._24_4_ = -fVar60;
  local_2480._28_4_ = -fVar60;
  auVar74 = ZEXT3264(local_2480);
  iVar26 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar26;
  local_24a0._0_4_ = iVar26;
  local_24a0._8_4_ = iVar26;
  local_24a0._12_4_ = iVar26;
  local_24a0._16_4_ = iVar26;
  local_24a0._20_4_ = iVar26;
  local_24a0._24_4_ = iVar26;
  local_24a0._28_4_ = iVar26;
  auVar77 = ZEXT3264(local_24a0);
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2820 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = &DAT_3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar51._16_4_ = 0x3f800000;
  auVar51._20_4_ = 0x3f800000;
  auVar51._24_4_ = 0x3f800000;
  auVar51._28_4_ = 0x3f800000;
  auVar58._8_4_ = 0xbf800000;
  auVar58._0_8_ = 0xbf800000bf800000;
  auVar58._12_4_ = 0xbf800000;
  auVar58._16_4_ = 0xbf800000;
  auVar58._20_4_ = 0xbf800000;
  auVar58._24_4_ = 0xbf800000;
  auVar58._28_4_ = 0xbf800000;
  local_24e0 = vblendvps_avx(auVar51,auVar58,local_24c0);
  do {
    do {
      do {
        if (local_2830 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar33 = local_2830 + -1;
        local_2830 = local_2830 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar33 + 8));
      uVar38 = *(ulong *)*local_2830;
      do {
        auVar71 = auVar74._0_32_;
        auVar39 = auVar68._0_32_;
        auVar61 = auVar63._0_32_;
        auVar51 = auVar59._0_32_;
        auVar58 = auVar56._0_32_;
        if ((uVar38 & 8) == 0) {
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + uVar34),auVar61,
                                    auVar85._0_32_);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + local_2838),auVar39,
                                    auVar58);
          auVar12 = vpmaxsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar48));
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + local_2840),auVar71,
                                    auVar51);
          auVar13 = vpmaxsd_avx2(ZEXT1632(auVar43),auVar77._0_32_);
          local_2700 = vpmaxsd_avx2(auVar12,auVar13);
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + (uVar34 ^ 0x20)),auVar61,
                                    auVar85._0_32_);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + uVar35),auVar39,auVar58);
          auVar12 = vpminsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar48));
          auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar38 + 0x40 + local_2818),auVar71,
                                    auVar51);
          auVar13 = vpminsd_avx2(ZEXT1632(auVar43),auVar42._0_32_);
          auVar12 = vpminsd_avx2(auVar12,auVar13);
          auVar12 = vpcmpgtd_avx2(local_2700,auVar12);
          uVar25 = vmovmskps_avx(auVar12);
          unaff_R13 = (ulong)(byte)~(byte)uVar25;
        }
        if ((uVar38 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar26 = 4;
          }
          else {
            uVar37 = uVar38 & 0xfffffffffffffff0;
            lVar36 = 0;
            for (uVar38 = unaff_R13; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar36 = lVar36 + 1;
            }
            iVar26 = 0;
            uVar30 = unaff_R13 - 1 & unaff_R13;
            uVar38 = *(ulong *)(uVar37 + lVar36 * 8);
            if (uVar30 != 0) {
              uVar67 = *(uint *)(local_2700 + lVar36 * 4);
              lVar36 = 0;
              for (uVar14 = uVar30; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar36 = lVar36 + 1;
              }
              uVar30 = uVar30 - 1 & uVar30;
              uVar14 = *(ulong *)(uVar37 + lVar36 * 8);
              uVar27 = *(uint *)(local_2700 + lVar36 * 4);
              if (uVar30 == 0) {
                if (uVar67 < uVar27) {
                  *(ulong *)*local_2830 = uVar14;
                  *(uint *)(*local_2830 + 8) = uVar27;
                  local_2830 = local_2830 + 1;
                }
                else {
                  *(ulong *)*local_2830 = uVar38;
                  *(uint *)(*local_2830 + 8) = uVar67;
                  local_2830 = local_2830 + 1;
                  uVar38 = uVar14;
                }
              }
              else {
                auVar43._8_8_ = 0;
                auVar43._0_8_ = uVar38;
                auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar67));
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar14;
                auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar27));
                lVar36 = 0;
                for (uVar38 = uVar30; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
                {
                  lVar36 = lVar36 + 1;
                }
                uVar30 = uVar30 - 1 & uVar30;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = *(ulong *)(uVar37 + lVar36 * 8);
                auVar44 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_2700 + lVar36 * 4)));
                auVar50 = vpcmpgtd_avx(auVar48,auVar43);
                if (uVar30 == 0) {
                  auVar54 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar48,auVar43,auVar54);
                  auVar43 = vblendvps_avx(auVar43,auVar48,auVar54);
                  auVar48 = vpcmpgtd_avx(auVar44,auVar50);
                  auVar54 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar44,auVar50,auVar54);
                  auVar50 = vblendvps_avx(auVar50,auVar44,auVar54);
                  auVar44 = vpcmpgtd_avx(auVar50,auVar43);
                  auVar54 = vpshufd_avx(auVar44,0xaa);
                  auVar44 = vblendvps_avx(auVar50,auVar43,auVar54);
                  auVar43 = vblendvps_avx(auVar43,auVar50,auVar54);
                  *local_2830 = auVar43;
                  local_2830[1] = auVar44;
                  uVar38 = auVar48._0_8_;
                  local_2830 = local_2830 + 2;
                }
                else {
                  lVar36 = 0;
                  for (uVar38 = uVar30; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000
                      ) {
                    lVar36 = lVar36 + 1;
                  }
                  uVar30 = uVar30 - 1 & uVar30;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = *(ulong *)(uVar37 + lVar36 * 8);
                  auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2700 + lVar36 * 4)));
                  if (uVar30 == 0) {
                    auVar15 = vpshufd_avx(auVar50,0xaa);
                    auVar50 = vblendvps_avx(auVar48,auVar43,auVar15);
                    auVar43 = vblendvps_avx(auVar43,auVar48,auVar15);
                    auVar48 = vpcmpgtd_avx(auVar54,auVar44);
                    auVar15 = vpshufd_avx(auVar48,0xaa);
                    auVar48 = vblendvps_avx(auVar54,auVar44,auVar15);
                    auVar44 = vblendvps_avx(auVar44,auVar54,auVar15);
                    auVar54 = vpcmpgtd_avx(auVar44,auVar43);
                    auVar15 = vpshufd_avx(auVar54,0xaa);
                    auVar54 = vblendvps_avx(auVar44,auVar43,auVar15);
                    auVar43 = vblendvps_avx(auVar43,auVar44,auVar15);
                    auVar44 = vpcmpgtd_avx(auVar48,auVar50);
                    auVar15 = vpshufd_avx(auVar44,0xaa);
                    auVar44 = vblendvps_avx(auVar48,auVar50,auVar15);
                    auVar48 = vblendvps_avx(auVar50,auVar48,auVar15);
                    auVar50 = vpcmpgtd_avx(auVar54,auVar48);
                    auVar15 = vpshufd_avx(auVar50,0xaa);
                    auVar50 = vblendvps_avx(auVar54,auVar48,auVar15);
                    auVar48 = vblendvps_avx(auVar48,auVar54,auVar15);
                    *local_2830 = auVar43;
                    local_2830[1] = auVar48;
                    local_2830[2] = auVar50;
                    uVar38 = auVar44._0_8_;
                    pauVar33 = local_2830 + 3;
                  }
                  else {
                    *local_2830 = auVar43;
                    local_2830[1] = auVar48;
                    local_2830[2] = auVar44;
                    local_2830[3] = auVar54;
                    lVar36 = 0x30;
                    do {
                      lVar31 = lVar36;
                      lVar36 = 0;
                      for (uVar38 = uVar30; (uVar38 & 1) == 0;
                          uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                        lVar36 = lVar36 + 1;
                      }
                      auVar44._8_8_ = 0;
                      auVar44._0_8_ = *(ulong *)(uVar37 + lVar36 * 8);
                      auVar43 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_2700 + lVar36 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2830[1] + lVar31) = auVar43;
                      uVar30 = uVar30 - 1 & uVar30;
                      lVar36 = lVar31 + 0x10;
                    } while (uVar30 != 0);
                    pauVar33 = (undefined1 (*) [16])(local_2830[1] + lVar31);
                    if (lVar31 + 0x10 != 0) {
                      lVar36 = 0x10;
                      pauVar29 = local_2830;
                      do {
                        auVar43 = pauVar29[1];
                        uVar67 = *(uint *)(pauVar29[1] + 8);
                        pauVar29 = pauVar29 + 1;
                        lVar31 = lVar36;
                        do {
                          if (uVar67 <= *(uint *)(local_2830[-1] + lVar31 + 8)) {
                            pauVar32 = (undefined1 (*) [16])(*local_2830 + lVar31);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2830 + lVar31) =
                               *(undefined1 (*) [16])(local_2830[-1] + lVar31);
                          lVar31 = lVar31 + -0x10;
                          pauVar32 = local_2830;
                        } while (lVar31 != 0);
                        *pauVar32 = auVar43;
                        lVar36 = lVar36 + 0x10;
                      } while (pauVar33 != pauVar29);
                    }
                    uVar38 = *(ulong *)*pauVar33;
                  }
                  auVar56 = ZEXT3264(auVar58);
                  auVar59 = ZEXT3264(auVar51);
                  auVar63 = ZEXT3264(auVar61);
                  auVar68 = ZEXT3264(auVar39);
                  auVar74 = ZEXT3264(auVar71);
                  auVar77 = ZEXT3264(auVar77._0_32_);
                  local_2830 = pauVar33;
                  iVar26 = 0;
                }
              }
            }
          }
        }
        else {
          iVar26 = 6;
        }
      } while (iVar26 == 0);
    } while (iVar26 != 6);
    local_2848 = (ulong)((uint)uVar38 & 0xf) - 8;
    if (local_2848 != 0) {
      uVar38 = uVar38 & 0xfffffffffffffff0;
      lVar36 = 0;
      do {
        lVar28 = lVar36 * 0xe0;
        lVar31 = uVar38 + 0xd0 + lVar28;
        local_27c0 = *(undefined8 *)(lVar31 + 0x10);
        uStack_27b8 = *(undefined8 *)(lVar31 + 0x18);
        lVar31 = uVar38 + 0xc0 + lVar28;
        local_23c0 = *(undefined8 *)(lVar31 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar31 + 0x18);
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        uStack_27b0 = local_27c0;
        uStack_27a8 = uStack_27b8;
        auVar52._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x60 + lVar28);
        auVar52._0_16_ = *(undefined1 (*) [16])(uVar38 + lVar28);
        auVar55._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x70 + lVar28);
        auVar55._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x10 + lVar28);
        auVar57._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x80 + lVar28);
        auVar57._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x20 + lVar28);
        auVar43 = *(undefined1 (*) [16])(uVar38 + 0x30 + lVar28);
        auVar39._16_16_ = auVar43;
        auVar39._0_16_ = auVar43;
        auVar48 = *(undefined1 (*) [16])(uVar38 + 0x40 + lVar28);
        auVar46._16_16_ = auVar48;
        auVar46._0_16_ = auVar48;
        auVar50 = *(undefined1 (*) [16])(uVar38 + 0x50 + lVar28);
        auVar49._16_16_ = auVar50;
        auVar49._0_16_ = auVar50;
        auVar50 = *(undefined1 (*) [16])(uVar38 + 0x90 + lVar28);
        auVar53._16_16_ = auVar50;
        auVar53._0_16_ = auVar50;
        auVar50 = *(undefined1 (*) [16])(uVar38 + 0xa0 + lVar28);
        auVar72._16_16_ = auVar50;
        auVar72._0_16_ = auVar50;
        auVar50 = *(undefined1 (*) [16])(uVar38 + 0xb0 + lVar28);
        auVar75._16_16_ = auVar50;
        auVar75._0_16_ = auVar50;
        auVar51 = vsubps_avx(auVar52,auVar39);
        auVar58 = vsubps_avx(auVar55,auVar46);
        auVar61 = vsubps_avx(auVar57,auVar49);
        auVar39 = vsubps_avx(auVar53,auVar52);
        auVar71 = vsubps_avx(auVar72,auVar55);
        auVar12 = vsubps_avx(auVar75,auVar57);
        auVar13._4_4_ = auVar58._4_4_ * auVar12._4_4_;
        auVar13._0_4_ = auVar58._0_4_ * auVar12._0_4_;
        auVar13._8_4_ = auVar58._8_4_ * auVar12._8_4_;
        auVar13._12_4_ = auVar58._12_4_ * auVar12._12_4_;
        auVar13._16_4_ = auVar58._16_4_ * auVar12._16_4_;
        auVar13._20_4_ = auVar58._20_4_ * auVar12._20_4_;
        auVar13._24_4_ = auVar58._24_4_ * auVar12._24_4_;
        auVar13._28_4_ = auVar43._12_4_;
        auVar44 = vfmsub231ps_fma(auVar13,auVar71,auVar61);
        uVar25 = *(undefined4 *)(ray + k * 4);
        auVar78._4_4_ = uVar25;
        auVar78._0_4_ = uVar25;
        auVar78._8_4_ = uVar25;
        auVar78._12_4_ = uVar25;
        auVar78._16_4_ = uVar25;
        auVar78._20_4_ = uVar25;
        auVar78._24_4_ = uVar25;
        auVar78._28_4_ = uVar25;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar81._4_4_ = uVar25;
        auVar81._0_4_ = uVar25;
        auVar81._8_4_ = uVar25;
        auVar81._12_4_ = uVar25;
        auVar81._16_4_ = uVar25;
        auVar81._20_4_ = uVar25;
        auVar81._24_4_ = uVar25;
        auVar81._28_4_ = uVar25;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar83._4_4_ = uVar25;
        auVar83._0_4_ = uVar25;
        auVar83._8_4_ = uVar25;
        auVar83._12_4_ = uVar25;
        auVar83._16_4_ = uVar25;
        auVar83._20_4_ = uVar25;
        auVar83._24_4_ = uVar25;
        auVar83._28_4_ = uVar25;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar73._4_4_ = fVar1;
        auVar73._0_4_ = fVar1;
        auVar73._8_4_ = fVar1;
        auVar73._12_4_ = fVar1;
        auVar73._16_4_ = fVar1;
        auVar73._20_4_ = fVar1;
        auVar73._24_4_ = fVar1;
        auVar73._28_4_ = fVar1;
        auVar11._4_4_ = auVar61._4_4_ * auVar39._4_4_;
        auVar11._0_4_ = auVar61._0_4_ * auVar39._0_4_;
        auVar11._8_4_ = auVar61._8_4_ * auVar39._8_4_;
        auVar11._12_4_ = auVar61._12_4_ * auVar39._12_4_;
        auVar11._16_4_ = auVar61._16_4_ * auVar39._16_4_;
        auVar11._20_4_ = auVar61._20_4_ * auVar39._20_4_;
        auVar11._24_4_ = auVar61._24_4_ * auVar39._24_4_;
        auVar11._28_4_ = auVar48._12_4_;
        auVar13 = vsubps_avx(auVar52,auVar78);
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar79._4_4_ = fVar2;
        auVar79._0_4_ = fVar2;
        auVar79._8_4_ = fVar2;
        auVar79._12_4_ = fVar2;
        auVar79._16_4_ = fVar2;
        auVar79._20_4_ = fVar2;
        auVar79._24_4_ = fVar2;
        auVar79._28_4_ = fVar2;
        auVar54 = vfmsub231ps_fma(auVar11,auVar12,auVar51);
        auVar11 = vsubps_avx(auVar55,auVar81);
        fVar60 = *(float *)(ray + k * 4 + 0x60);
        auVar82._4_4_ = fVar60;
        auVar82._0_4_ = fVar60;
        auVar82._8_4_ = fVar60;
        auVar82._12_4_ = fVar60;
        auVar82._16_4_ = fVar60;
        auVar82._20_4_ = fVar60;
        auVar82._24_4_ = fVar60;
        auVar82._28_4_ = fVar60;
        auVar46 = vsubps_avx(auVar57,auVar83);
        auVar17._4_4_ = fVar1 * auVar11._4_4_;
        auVar17._0_4_ = fVar1 * auVar11._0_4_;
        auVar17._8_4_ = fVar1 * auVar11._8_4_;
        auVar17._12_4_ = fVar1 * auVar11._12_4_;
        auVar17._16_4_ = fVar1 * auVar11._16_4_;
        auVar17._20_4_ = fVar1 * auVar11._20_4_;
        auVar17._24_4_ = fVar1 * auVar11._24_4_;
        auVar17._28_4_ = uVar25;
        auVar43 = vfmsub231ps_fma(auVar17,auVar13,auVar79);
        auVar18._4_4_ = auVar12._4_4_ * auVar43._4_4_;
        auVar18._0_4_ = auVar12._0_4_ * auVar43._0_4_;
        auVar18._8_4_ = auVar12._8_4_ * auVar43._8_4_;
        auVar18._12_4_ = auVar12._12_4_ * auVar43._12_4_;
        auVar18._16_4_ = auVar12._16_4_ * 0.0;
        auVar18._20_4_ = auVar12._20_4_ * 0.0;
        auVar18._24_4_ = auVar12._24_4_ * 0.0;
        auVar18._28_4_ = auVar12._28_4_;
        auVar84._0_4_ = auVar61._0_4_ * auVar43._0_4_;
        auVar84._4_4_ = auVar61._4_4_ * auVar43._4_4_;
        auVar84._8_4_ = auVar61._8_4_ * auVar43._8_4_;
        auVar84._12_4_ = auVar61._12_4_ * auVar43._12_4_;
        auVar84._16_4_ = auVar61._16_4_ * 0.0;
        auVar84._20_4_ = auVar61._20_4_ * 0.0;
        auVar84._24_4_ = auVar61._24_4_ * 0.0;
        auVar84._28_4_ = 0;
        auVar12._4_4_ = fVar60 * auVar13._4_4_;
        auVar12._0_4_ = fVar60 * auVar13._0_4_;
        auVar12._8_4_ = fVar60 * auVar13._8_4_;
        auVar12._12_4_ = fVar60 * auVar13._12_4_;
        auVar12._16_4_ = fVar60 * auVar13._16_4_;
        auVar12._20_4_ = fVar60 * auVar13._20_4_;
        auVar12._24_4_ = fVar60 * auVar13._24_4_;
        auVar12._28_4_ = auVar61._28_4_;
        auVar48 = vfmsub231ps_fma(auVar12,auVar46,auVar73);
        auVar43 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar48),auVar71);
        auVar48 = vfmadd231ps_fma(auVar84,auVar58,ZEXT1632(auVar48));
        auVar61._4_4_ = auVar51._4_4_ * auVar71._4_4_;
        auVar61._0_4_ = auVar51._0_4_ * auVar71._0_4_;
        auVar61._8_4_ = auVar51._8_4_ * auVar71._8_4_;
        auVar61._12_4_ = auVar51._12_4_ * auVar71._12_4_;
        auVar61._16_4_ = auVar51._16_4_ * auVar71._16_4_;
        auVar61._20_4_ = auVar51._20_4_ * auVar71._20_4_;
        auVar61._24_4_ = auVar51._24_4_ * auVar71._24_4_;
        auVar61._28_4_ = auVar71._28_4_;
        auVar15 = vfmsub231ps_fma(auVar61,auVar39,auVar58);
        auVar71._4_4_ = fVar2 * auVar46._4_4_;
        auVar71._0_4_ = fVar2 * auVar46._0_4_;
        auVar71._8_4_ = fVar2 * auVar46._8_4_;
        auVar71._12_4_ = fVar2 * auVar46._12_4_;
        auVar71._16_4_ = fVar2 * auVar46._16_4_;
        auVar71._20_4_ = fVar2 * auVar46._20_4_;
        auVar71._24_4_ = fVar2 * auVar46._24_4_;
        auVar71._28_4_ = auVar58._28_4_;
        auVar16 = vfmsub231ps_fma(auVar71,auVar11,auVar82);
        fVar1 = auVar15._0_4_;
        fVar2 = auVar15._4_4_;
        auVar19._4_4_ = fVar60 * fVar2;
        auVar19._0_4_ = fVar60 * fVar1;
        fVar6 = auVar15._8_4_;
        auVar19._8_4_ = fVar60 * fVar6;
        fVar7 = auVar15._12_4_;
        auVar19._12_4_ = fVar60 * fVar7;
        auVar19._16_4_ = fVar60 * 0.0;
        auVar19._20_4_ = fVar60 * 0.0;
        auVar19._24_4_ = fVar60 * 0.0;
        auVar19._28_4_ = fVar60;
        auVar50 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar54),auVar79);
        auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),ZEXT1632(auVar44),auVar73);
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),ZEXT1632(auVar16),auVar39);
        auVar58 = vandps_avx(ZEXT1632(auVar50),local_23e0);
        uVar67 = auVar58._0_4_;
        local_2700._0_4_ = (float)(uVar67 ^ auVar43._0_4_);
        uVar27 = auVar58._4_4_;
        local_2700._4_4_ = (float)(uVar27 ^ auVar43._4_4_);
        uVar69 = auVar58._8_4_;
        local_2700._8_4_ = (float)(uVar69 ^ auVar43._8_4_);
        uVar70 = auVar58._12_4_;
        local_2700._12_4_ = (float)(uVar70 ^ auVar43._12_4_);
        local_26c0._16_4_ = auVar58._16_4_;
        local_2700._16_4_ = local_26c0._16_4_;
        local_26c0._20_4_ = auVar58._20_4_;
        local_2700._20_4_ = local_26c0._20_4_;
        local_26c0._24_4_ = auVar58._24_4_;
        local_2700._24_4_ = local_26c0._24_4_;
        local_26c0._28_4_ = auVar58._28_4_;
        local_2700._28_4_ = local_26c0._28_4_;
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar51,ZEXT1632(auVar16));
        local_26e0._0_4_ = (float)(uVar67 ^ auVar43._0_4_);
        local_26e0._4_4_ = (float)(uVar27 ^ auVar43._4_4_);
        local_26e0._8_4_ = (float)(uVar69 ^ auVar43._8_4_);
        local_26e0._12_4_ = (float)(uVar70 ^ auVar43._12_4_);
        local_26e0._16_4_ = local_26c0._16_4_;
        local_26e0._20_4_ = local_26c0._20_4_;
        local_26e0._24_4_ = local_26c0._24_4_;
        local_26e0._28_4_ = local_26c0._28_4_;
        auVar58 = vcmpps_avx(local_2700,ZEXT832(0) << 0x20,5);
        auVar51 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
        auVar58 = vandps_avx(auVar58,auVar51);
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar62._16_4_ = 0x7fffffff;
        auVar62._20_4_ = 0x7fffffff;
        auVar62._24_4_ = 0x7fffffff;
        auVar62._28_4_ = 0x7fffffff;
        local_26a0 = vandps_avx(ZEXT1632(auVar50),auVar62);
        auVar51 = vcmpps_avx(ZEXT1632(auVar50),ZEXT832(0) << 0x20,4);
        auVar58 = vandps_avx(auVar58,auVar51);
        auVar76._0_4_ = local_2700._0_4_ + local_26e0._0_4_;
        auVar76._4_4_ = local_2700._4_4_ + local_26e0._4_4_;
        auVar76._8_4_ = local_2700._8_4_ + local_26e0._8_4_;
        auVar76._12_4_ = local_2700._12_4_ + local_26e0._12_4_;
        auVar76._16_4_ = local_26c0._16_4_ + local_26c0._16_4_;
        auVar76._20_4_ = local_26c0._20_4_ + local_26c0._20_4_;
        auVar76._24_4_ = local_26c0._24_4_ + local_26c0._24_4_;
        auVar76._28_4_ = local_26c0._28_4_ + local_26c0._28_4_;
        auVar51 = vcmpps_avx(auVar76,local_26a0,2);
        auVar61 = auVar51 & auVar58;
        if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar61 >> 0x7f,0) != '\0') ||
              (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar61 >> 0xbf,0) != '\0') ||
            (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar61[0x1f] < '\0') {
          auVar58 = vandps_avx(auVar58,auVar51);
          auVar43 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          auVar20._4_4_ = fVar2 * auVar46._4_4_;
          auVar20._0_4_ = fVar1 * auVar46._0_4_;
          auVar20._8_4_ = fVar6 * auVar46._8_4_;
          auVar20._12_4_ = fVar7 * auVar46._12_4_;
          auVar20._16_4_ = auVar46._16_4_ * 0.0;
          auVar20._20_4_ = auVar46._20_4_ * 0.0;
          auVar20._24_4_ = auVar46._24_4_ * 0.0;
          auVar20._28_4_ = auVar46._28_4_;
          auVar48 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar54),auVar20);
          auVar48 = vfmadd213ps_fma(auVar13,ZEXT1632(auVar44),ZEXT1632(auVar48));
          local_26c0._0_4_ = (float)(uVar67 ^ auVar48._0_4_);
          local_26c0._4_4_ = (float)(uVar27 ^ auVar48._4_4_);
          local_26c0._8_4_ = (float)(uVar69 ^ auVar48._8_4_);
          local_26c0._12_4_ = (float)(uVar70 ^ auVar48._12_4_);
          fVar60 = *(float *)(ray + k * 4 + 0x30);
          auVar21._4_4_ = local_26a0._4_4_ * fVar60;
          auVar21._0_4_ = local_26a0._0_4_ * fVar60;
          auVar21._8_4_ = local_26a0._8_4_ * fVar60;
          auVar21._12_4_ = local_26a0._12_4_ * fVar60;
          auVar21._16_4_ = local_26a0._16_4_ * fVar60;
          auVar21._20_4_ = local_26a0._20_4_ * fVar60;
          auVar21._24_4_ = local_26a0._24_4_ * fVar60;
          auVar21._28_4_ = fVar60;
          auVar58 = vcmpps_avx(auVar21,local_26c0,1);
          fVar60 = *(float *)(ray + k * 4 + 0x80);
          auVar22._4_4_ = local_26a0._4_4_ * fVar60;
          auVar22._0_4_ = local_26a0._0_4_ * fVar60;
          auVar22._8_4_ = local_26a0._8_4_ * fVar60;
          auVar22._12_4_ = local_26a0._12_4_ * fVar60;
          auVar22._16_4_ = local_26a0._16_4_ * fVar60;
          auVar22._20_4_ = local_26a0._20_4_ * fVar60;
          auVar22._24_4_ = local_26a0._24_4_ * fVar60;
          auVar22._28_4_ = fVar60;
          auVar51 = vcmpps_avx(local_26c0,auVar22,2);
          auVar58 = vandps_avx(auVar58,auVar51);
          auVar48 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          auVar43 = vpand_avx(auVar43,auVar48);
          auVar58 = vpmovzxwd_avx2(auVar43);
          auVar58 = vpslld_avx2(auVar58,0x1f);
          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar58 >> 0x7f,0) != '\0') ||
                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar58 >> 0xbf,0) != '\0') ||
              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar58[0x1f] < '\0') {
            local_27e0 = vpsrad_avx2(auVar58,0x1f);
            local_2680 = ZEXT1632(auVar44);
            local_2660 = ZEXT1632(auVar54);
            local_2640 = ZEXT1632(auVar15);
            local_2620 = local_27e0;
            local_2540 = local_24c0;
            local_2828 = context->scene;
            auVar51 = vrcpps_avx(local_26a0);
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = &DAT_3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar80._16_4_ = 0x3f800000;
            auVar80._20_4_ = 0x3f800000;
            auVar80._24_4_ = 0x3f800000;
            auVar80._28_4_ = 0x3f800000;
            auVar48 = vfnmadd213ps_fma(local_26a0,auVar51,auVar80);
            auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar51,auVar51);
            fVar60 = auVar48._0_4_;
            fVar64 = auVar48._4_4_;
            local_25c0._4_4_ = fVar64 * local_26c0._4_4_;
            local_25c0._0_4_ = fVar60 * local_26c0._0_4_;
            fVar65 = auVar48._8_4_;
            local_25c0._8_4_ = fVar65 * local_26c0._8_4_;
            fVar66 = auVar48._12_4_;
            local_25c0._12_4_ = fVar66 * local_26c0._12_4_;
            local_25c0._16_4_ = local_26c0._16_4_ * 0.0;
            local_25c0._20_4_ = local_26c0._20_4_ * 0.0;
            local_25c0._24_4_ = local_26c0._24_4_ * 0.0;
            local_25c0._28_4_ = auVar51._28_4_;
            auVar42 = ZEXT3264(local_25c0);
            auVar23._4_4_ = fVar64 * local_2700._4_4_;
            auVar23._0_4_ = fVar60 * local_2700._0_4_;
            auVar23._8_4_ = fVar65 * local_2700._8_4_;
            auVar23._12_4_ = fVar66 * local_2700._12_4_;
            auVar23._16_4_ = local_26c0._16_4_ * 0.0;
            auVar23._20_4_ = local_26c0._20_4_ * 0.0;
            auVar23._24_4_ = local_26c0._24_4_ * 0.0;
            auVar23._28_4_ = local_26c0._28_4_;
            auVar51 = vminps_avx(auVar23,auVar80);
            auVar24._4_4_ = fVar64 * local_26e0._4_4_;
            auVar24._0_4_ = fVar60 * local_26e0._0_4_;
            auVar24._8_4_ = fVar65 * local_26e0._8_4_;
            auVar24._12_4_ = fVar66 * local_26e0._12_4_;
            auVar24._16_4_ = local_26c0._16_4_ * 0.0;
            auVar24._20_4_ = local_26c0._20_4_ * 0.0;
            auVar24._24_4_ = local_26c0._24_4_ * 0.0;
            auVar24._28_4_ = local_26c0._28_4_;
            auVar61 = vminps_avx(auVar24,auVar80);
            auVar39 = vsubps_avx(auVar80,auVar51);
            auVar71 = vsubps_avx(auVar80,auVar61);
            local_25e0 = vblendvps_avx(auVar61,auVar39,local_24c0);
            local_2600 = vblendvps_avx(auVar51,auVar71,local_24c0);
            fVar60 = local_24e0._0_4_;
            local_25a0._0_4_ = auVar44._0_4_ * fVar60;
            fVar64 = local_24e0._4_4_;
            local_25a0._4_4_ = auVar44._4_4_ * fVar64;
            fVar65 = local_24e0._8_4_;
            local_25a0._8_4_ = auVar44._8_4_ * fVar65;
            fVar66 = local_24e0._12_4_;
            local_25a0._12_4_ = auVar44._12_4_ * fVar66;
            fVar8 = local_24e0._16_4_;
            local_25a0._16_4_ = fVar8 * 0.0;
            fVar9 = local_24e0._20_4_;
            local_25a0._20_4_ = fVar9 * 0.0;
            fVar10 = local_24e0._24_4_;
            local_25a0._24_4_ = fVar10 * 0.0;
            local_25a0._28_4_ = 0;
            local_2580._0_4_ = fVar60 * auVar54._0_4_;
            local_2580._4_4_ = fVar64 * auVar54._4_4_;
            local_2580._8_4_ = fVar65 * auVar54._8_4_;
            local_2580._12_4_ = fVar66 * auVar54._12_4_;
            local_2580._16_4_ = fVar8 * 0.0;
            local_2580._20_4_ = fVar9 * 0.0;
            local_2580._24_4_ = fVar10 * 0.0;
            local_2580._28_4_ = 0;
            local_2560._0_4_ = fVar60 * fVar1;
            local_2560._4_4_ = fVar64 * fVar2;
            local_2560._8_4_ = fVar65 * fVar6;
            local_2560._12_4_ = fVar66 * fVar7;
            local_2560._16_4_ = fVar8 * 0.0;
            local_2560._20_4_ = fVar9 * 0.0;
            local_2560._24_4_ = fVar10 * 0.0;
            local_2560._28_4_ = 0;
            auVar40._8_4_ = 0x7f800000;
            auVar40._0_8_ = 0x7f8000007f800000;
            auVar40._12_4_ = 0x7f800000;
            auVar40._16_4_ = 0x7f800000;
            auVar40._20_4_ = 0x7f800000;
            auVar40._24_4_ = 0x7f800000;
            auVar40._28_4_ = 0x7f800000;
            auVar58 = vblendvps_avx(auVar40,local_25c0,auVar58);
            auVar51 = vshufps_avx(auVar58,auVar58,0xb1);
            auVar51 = vminps_avx(auVar58,auVar51);
            auVar61 = vshufpd_avx(auVar51,auVar51,5);
            auVar51 = vminps_avx(auVar51,auVar61);
            auVar61 = vpermpd_avx2(auVar51,0x4e);
            auVar51 = vminps_avx(auVar51,auVar61);
            auVar58 = vcmpps_avx(auVar58,auVar51,0);
            auVar48 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar43 = vpand_avx(auVar48,auVar43);
            auVar58 = vpmovzxwd_avx2(auVar43);
            auVar58 = vpslld_avx2(auVar58,0x1f);
            if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar58 >> 0x7f,0) == '\0') &&
                  (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar58 >> 0xbf,0) == '\0') &&
                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar58[0x1f]) {
              auVar58 = local_27e0;
            }
            uVar27 = vmovmskps_avx(auVar58);
            uVar67 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
              uVar67 = uVar67 + 1;
            }
            do {
              uVar37 = (ulong)uVar67;
              uVar67 = *(uint *)((long)&local_23c0 + uVar37 * 4);
              pGVar4 = (local_2828->geometries).items[uVar67].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_27e0 + uVar37 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar25 = *(undefined4 *)(local_2600 + uVar37 * 4);
                  uVar3 = *(undefined4 *)(local_25e0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25a0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2580 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2560 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar25;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_27c0 + uVar37 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar67;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                local_2520 = auVar42._0_32_;
                local_2500 = auVar85._0_32_;
                uVar25 = *(undefined4 *)(local_2600 + uVar37 * 4);
                local_2760._4_4_ = uVar25;
                local_2760._0_4_ = uVar25;
                local_2760._8_4_ = uVar25;
                local_2760._12_4_ = uVar25;
                local_2750 = *(undefined4 *)(local_25e0 + uVar37 * 4);
                local_2730._4_4_ = uVar67;
                local_2730._0_4_ = uVar67;
                local_2730._8_4_ = uVar67;
                local_2730._12_4_ = uVar67;
                uVar25 = *(undefined4 *)((long)&local_27c0 + uVar37 * 4);
                local_2740._4_4_ = uVar25;
                local_2740._0_4_ = uVar25;
                local_2740._8_4_ = uVar25;
                local_2740._12_4_ = uVar25;
                uVar25 = *(undefined4 *)(local_25a0 + uVar37 * 4);
                uVar3 = *(undefined4 *)(local_2580 + uVar37 * 4);
                local_2780._4_4_ = uVar3;
                local_2780._0_4_ = uVar3;
                local_2780._8_4_ = uVar3;
                local_2780._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_2560 + uVar37 * 4);
                local_2770._4_4_ = uVar3;
                local_2770._0_4_ = uVar3;
                local_2770._8_4_ = uVar3;
                local_2770._12_4_ = uVar3;
                local_2790[0] = (RTCHitN)(char)uVar25;
                local_2790[1] = (RTCHitN)(char)((uint)uVar25 >> 8);
                local_2790[2] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                local_2790[3] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                local_2790[4] = (RTCHitN)(char)uVar25;
                local_2790[5] = (RTCHitN)(char)((uint)uVar25 >> 8);
                local_2790[6] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                local_2790[7] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                local_2790[8] = (RTCHitN)(char)uVar25;
                local_2790[9] = (RTCHitN)(char)((uint)uVar25 >> 8);
                local_2790[10] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                local_2790[0xb] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                local_2790[0xc] = (RTCHitN)(char)uVar25;
                local_2790[0xd] = (RTCHitN)(char)((uint)uVar25 >> 8);
                local_2790[0xe] = (RTCHitN)(char)((uint)uVar25 >> 0x10);
                local_2790[0xf] = (RTCHitN)(char)((uint)uVar25 >> 0x18);
                uStack_274c = local_2750;
                uStack_2748 = local_2750;
                uStack_2744 = local_2750;
                vpcmpeqd_avx2(ZEXT1632(local_2760),ZEXT1632(local_2760));
                uStack_271c = context->user->instID[0];
                local_2720 = uStack_271c;
                uStack_2718 = uStack_271c;
                uStack_2714 = uStack_271c;
                uStack_2710 = context->user->instPrimID[0];
                uStack_270c = uStack_2710;
                uStack_2708 = uStack_2710;
                uStack_2704 = uStack_2710;
                uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar37 * 4);
                local_2860 = *local_2820;
                uStack_2858 = local_2820[1];
                local_2810.valid = (int *)&local_2860;
                local_2810.geometryUserPtr = pGVar4->userPtr;
                local_2810.context = context->user;
                local_2810.hit = local_2790;
                local_2810.N = 4;
                local_2810.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->intersectionFilterN)(&local_2810);
                }
                auVar15._8_8_ = uStack_2858;
                auVar15._0_8_ = local_2860;
                if (auVar15 == (undefined1  [16])0x0) {
                  auVar43 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar43 = auVar43 ^ _DAT_01febe20;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_2810);
                  }
                  auVar16._8_8_ = uStack_2858;
                  auVar16._0_8_ = local_2860;
                  auVar48 = vpcmpeqd_avx(auVar16,_DAT_01feba10);
                  auVar43 = auVar48 ^ _DAT_01febe20;
                  if (auVar16 != (undefined1  [16])0x0) {
                    auVar48 = auVar48 ^ _DAT_01febe20;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])local_2810.hit);
                    *(undefined1 (*) [16])(local_2810.ray + 0xc0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x10));
                    *(undefined1 (*) [16])(local_2810.ray + 0xd0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x20));
                    *(undefined1 (*) [16])(local_2810.ray + 0xe0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x30));
                    *(undefined1 (*) [16])(local_2810.ray + 0xf0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x40));
                    *(undefined1 (*) [16])(local_2810.ray + 0x100) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x50));
                    *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x60));
                    *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x70));
                    *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar50;
                    auVar48 = vmaskmovps_avx(auVar48,*(undefined1 (*) [16])(local_2810.hit + 0x80));
                    *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar48;
                  }
                }
                auVar45._8_8_ = 0x100000001;
                auVar45._0_8_ = 0x100000001;
                if ((auVar45 & auVar43) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar25;
                }
                *(undefined4 *)(local_27e0 + uVar37 * 4) = 0;
                uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar41._4_4_ = uVar25;
                auVar41._0_4_ = uVar25;
                auVar41._8_4_ = uVar25;
                auVar41._12_4_ = uVar25;
                auVar41._16_4_ = uVar25;
                auVar41._20_4_ = uVar25;
                auVar41._24_4_ = uVar25;
                auVar41._28_4_ = uVar25;
                auVar42 = ZEXT3264(local_2520);
                auVar58 = vcmpps_avx(local_2520,auVar41,2);
                local_27e0 = vandps_avx(auVar58,local_27e0);
                auVar85 = ZEXT3264(local_2500);
              }
              if ((((((((local_27e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_27e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_27e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_27e0 >> 0x7f,0) == '\0') &&
                    (local_27e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_27e0 >> 0xbf,0) == '\0') &&
                  (local_27e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_27e0[0x1f]) break;
              auVar47._8_4_ = 0x7f800000;
              auVar47._0_8_ = 0x7f8000007f800000;
              auVar47._12_4_ = 0x7f800000;
              auVar47._16_4_ = 0x7f800000;
              auVar47._20_4_ = 0x7f800000;
              auVar47._24_4_ = 0x7f800000;
              auVar47._28_4_ = 0x7f800000;
              auVar58 = vblendvps_avx(auVar47,auVar42._0_32_,local_27e0);
              auVar51 = vshufps_avx(auVar58,auVar58,0xb1);
              auVar51 = vminps_avx(auVar58,auVar51);
              auVar61 = vshufpd_avx(auVar51,auVar51,5);
              auVar51 = vminps_avx(auVar51,auVar61);
              auVar61 = vpermpd_avx2(auVar51,0x4e);
              auVar51 = vminps_avx(auVar51,auVar61);
              auVar51 = vcmpps_avx(auVar58,auVar51,0);
              auVar61 = local_27e0 & auVar51;
              auVar58 = local_27e0;
              if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar61 >> 0x7f,0) != '\0') ||
                    (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar61 >> 0xbf,0) != '\0') ||
                  (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar61[0x1f] < '\0') {
                auVar58 = vandps_avx(auVar51,local_27e0);
              }
              uVar27 = vmovmskps_avx(auVar58);
              uVar67 = 0;
              for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                uVar67 = uVar67 + 1;
              }
            } while( true );
          }
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != local_2848);
    }
    uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar42 = ZEXT3264(CONCAT428(uVar25,CONCAT424(uVar25,CONCAT420(uVar25,CONCAT416(uVar25,CONCAT412
                                                  (uVar25,CONCAT48(uVar25,CONCAT44(uVar25,uVar25))))
                                                  ))));
    auVar56 = ZEXT3264(local_2400);
    auVar59 = ZEXT3264(local_2420);
    auVar63 = ZEXT3264(local_2440);
    auVar68 = ZEXT3264(local_2460);
    auVar74 = ZEXT3264(local_2480);
    auVar77 = ZEXT3264(local_24a0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }